

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Symbol>::copyAppend
          (QGenericArrayOps<QCss::Symbol> *this,Symbol *b,Symbol *e)

{
  Symbol *pSVar1;
  Data *pDVar2;
  int iVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QCss::Symbol>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QCss::Symbol>).size;
    do {
      pSVar1[lVar4].token = b->token;
      pDVar2 = (b->text).d.d;
      pSVar1[lVar4].text.d.d = pDVar2;
      pSVar1[lVar4].text.d.ptr = (b->text).d.ptr;
      pSVar1[lVar4].text.d.size = (b->text).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar3 = b->len;
      pSVar1[lVar4].start = b->start;
      pSVar1[lVar4].len = iVar3;
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<QCss::Symbol>).size + 1;
      (this->super_QArrayDataPointer<QCss::Symbol>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }